

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::~PromiseDataBase
          (PromiseDataBase<QString,_void_(const_QString_&)> *this)

{
  PromiseDataBase<QString,_void_(const_QString_&)> *this_local;
  
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001ae630;
  PromiseError::~PromiseError(&this->m_error);
  QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  ::~QList(&this->m_catchers);
  QList<std::pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_>_>::~QList
            ((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_>_> *)
             &this->m_handlers);
  QReadWriteLock::~QReadWriteLock(&this->m_lock);
  return;
}

Assistant:

virtual ~PromiseDataBase() { }